

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables.c
# Opt level: O2

int parse_ip(char *str,in_addr *addr,in_addr *mask)

{
  int iVar1;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar2;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar3;
  int prefix;
  char ip [16];
  
  ip[0] = '\0';
  ip[1] = '\0';
  ip[2] = '\0';
  ip[3] = '\0';
  ip[4] = '\0';
  ip[5] = '\0';
  ip[6] = '\0';
  ip[7] = '\0';
  ip[8] = '\0';
  ip[9] = '\0';
  ip[10] = '\0';
  ip[0xb] = '\0';
  ip[0xc] = '\0';
  ip[0xd] = '\0';
  ip[0xe] = '\0';
  ip[0xf] = '\0';
  iVar1 = __isoc99_sscanf(str,"%15[^/]/%d");
  uVar2 = extraout_XMM0_Da;
  uVar3 = extraout_XMM0_Db;
  if ((iVar1 < 1) ||
     (iVar1 = inet_pton(2,ip,addr), uVar2 = extraout_XMM0_Da_00, uVar3 = extraout_XMM0_Db_00,
     iVar1 != 1)) {
    _log((double)CONCAT44(uVar3,uVar2));
    iVar1 = -1;
  }
  else {
    mask->s_addr = 0xffffffff;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int parse_ip(char *str, struct in_addr *addr, struct in_addr *mask)
{
	int prefix = -1;
	char ip[16] = {0};

	if (sscanf(str, "%15[^/]/%d", ip, &prefix) > 0) {

		if (inet_pton(AF_INET, ip, addr) != 1) {
			log_err("inet_pton failed: %s\n", ip);
			return -1;
		}

		if (prefix == 0) {
			mask->s_addr = 0;
		} else if (prefix > 0 && prefix <= 32) {
			mask->s_addr = htonl(0xFFFFFFFF << (32 - prefix));
		} else if (prefix == -1) {
			mask->s_addr = 0xFFFFFFFF;
		} else {
			log_err("mask \"%d\" is invalid\n", prefix);
			return -1;
		}
	} else {
		log_err("ip \"%s\" is invalid\n", str);
		return -1;
	}

	return 0;
}